

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dijkstra.h
# Opt level: O1

void relax_from_v_sync(vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                       *adj_list,int relax_v,vector<int,_std::allocator<int>_> *dists)

{
  int iVar1;
  pointer pvVar2;
  long lVar3;
  pointer piVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  
  pvVar2 = (adj_list->
           super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&pvVar2[relax_v].
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data;
  lVar5 = (long)*(pointer *)
                 ((long)&pvVar2[relax_v].
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data + 8) - lVar3;
  if (lVar5 != 0) {
    lVar5 = lVar5 >> 3;
    piVar4 = (dists->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    lVar6 = 0;
    do {
      iVar1 = *(int *)(lVar3 + lVar6 * 8);
      iVar7 = piVar4[relax_v] + *(int *)(lVar3 + 4 + lVar6 * 8);
      if (iVar7 < piVar4[iVar1]) {
        piVar4[iVar1] = iVar7;
      }
      lVar6 = lVar6 + 1;
    } while (lVar5 + (ulong)(lVar5 == 0) != lVar6);
  }
  return;
}

Assistant:

void relax_from_v_sync(const vector<vector<pair<int, int>>>& adj_list, int relax_v, vector<int>& dists){
    int to, weight;
    for (int j=0; j<adj_list[relax_v].size(); j++){
        to = adj_list[relax_v][j].first;
        weight = adj_list[relax_v][j].second;
        if (dists[relax_v] + weight < dists[to]){
            // Relax
            dists[to] = dists[relax_v] + weight;
        }
    }
}